

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall
vera::Image::Image(Image *this,uint8_t *_array3D,int _height,int _width,int _channels)

{
  allocator local_39;
  vector<float,_std::allocator<float>_> *local_38;
  
  this->_vptr_Image = (_func_int **)&PTR__Image_003dea38;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->m_path,"",&local_39);
  local_38 = &this->m_data;
  (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (*this->_vptr_Image[0x10])(this,_array3D,(ulong)(uint)_height,(ulong)(uint)_width,_channels);
  return;
}

Assistant:

Image::Image(const uint8_t* _array3D, int _height, int _width, int _channels): m_path("") {
    set(_array3D, _height, _width, _channels);
}